

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O2

void __thiscall Hpipe::CharItem::write_dot_rec(CharItem *this,ostream *os)

{
  pointer pCVar1;
  int iVar2;
  ostream *poVar3;
  CharEdge *t;
  pointer pCVar4;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    poVar3 = std::operator<<(os,"  node_");
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    std::operator<<(poVar3," [label=\"");
    dot_out<Hpipe::CharItem>(os,this,-1);
    std::operator<<(os,"\"");
    std::operator<<(os,"];\n");
    pCVar1 = (this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
             super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar2 = 0;
    for (pCVar4 = (this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                  super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
                  super__Vector_impl_data._M_start; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
      if (pCVar4->item != (CharItem *)0x0) {
        write_dot_rec(pCVar4->item,os);
      }
      poVar3 = std::operator<<(os,"  node_");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      poVar3 = std::operator<<(poVar3," -> node_");
      std::ostream::_M_insert<void_const*>(poVar3);
      if (0x10 < (ulong)((long)(this->edges).
                               super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                               super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->edges).
                              super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                              super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                              _M_impl.super__Vector_impl_data._M_start)) {
        poVar3 = std::operator<<(os," [label=\"");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
        std::operator<<(poVar3,"\"]");
        iVar2 = iVar2 + 1;
      }
      std::operator<<(os,";\n");
    }
  }
  return;
}

Assistant:

void CharItem::write_dot_rec( std::ostream &os ) const {
    if ( op_id == CharItem::cur_op_id )
        return;
    op_id = CharItem::cur_op_id;

    os << "  node_" << this << " [label=\"";
    dot_out( os, *this );
    os << "\"";
    //if ( leads_to_ok )
    //    os << ",style=dotted";
    os << "];\n";

    int cpt = 0;
    for( const CharEdge &t : edges ) {
        if ( t.item )
            t.item->write_dot_rec( os );
        os << "  node_" << this << " -> node_" << t.item;
        if ( this->edges.size() >= 2 )
            os << " [label=\"" << cpt++ << "\"]";
        os << ";\n";
    }
}